

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * Fantasy_Rapunzel_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  byte bVar1;
  ulong uVar2;
  ulong *puVar3;
  byte *buf_00;
  ulong *puVar4;
  char *pcVar5;
  int err;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong *puVar11;
  bool bVar12;
  uint16_t val;
  int more;
  uint64_t value;
  uint16_t local_4a;
  int local_48;
  int local_44;
  uint64_t local_40;
  uint16_t *local_38;
  
  local_38 = (uint16_t *)struct_base;
  if ((buf == end) || (*buf != '{')) {
    local_48 = 0;
    puVar3 = (ulong *)flatcc_json_parser_set_error(ctx,buf,end,0x15);
    goto LAB_00116c3f;
  }
  puVar11 = (ulong *)(buf + 1);
  if ((long)end - (long)puVar11 < 2) {
LAB_00116be2:
    puVar11 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar11,end);
  }
  else if ((char)(byte)*puVar11 < '!') {
    if (((byte)*puVar11 != 0x20) || (buf[2] < '!')) goto LAB_00116be2;
    puVar11 = (ulong *)(buf + 2);
  }
  if ((puVar11 == (ulong *)end) || ((byte)*puVar11 != 0x7d)) {
    local_48 = 1;
    puVar3 = puVar11;
    goto LAB_00116c3f;
  }
  local_48 = 0;
  puVar3 = (ulong *)((long)puVar11 + 1);
  if (1 < (long)end - (long)puVar3) {
    if (' ' < (char)*(byte *)puVar3) goto LAB_00116c3f;
    if ((*(byte *)puVar3 == 0x20) && (' ' < (char)*(byte *)((long)puVar11 + 2))) {
      puVar3 = (ulong *)((long)puVar11 + 2);
      goto LAB_00116c3f;
    }
  }
  puVar3 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar3,end);
LAB_00116c3f:
  if (local_48 != 0) {
    do {
      if (puVar3 != (ulong *)end) {
        if ((byte)*puVar3 == 0x2e) {
          puVar3 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar3,end,5);
        }
        else if ((byte)*puVar3 == 0x22) {
          puVar3 = (ulong *)((long)puVar3 + 1);
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      if ((ulong)((long)end - (long)puVar3) < 8) {
        uVar6 = 0;
        switch((long)end - (long)puVar3) {
        case 7:
          uVar6 = (long)(char)*(byte *)((long)puVar3 + 6) << 8;
        case 6:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)puVar3 + 5) << 0x10;
        case 5:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)puVar3 + 4) << 0x18;
        case 4:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)puVar3 + 3) << 0x20;
        case 3:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)puVar3 + 2) << 0x28;
        case 2:
          uVar6 = uVar6 | (long)(char)*(byte *)((long)puVar3 + 1) << 0x30;
        case 1:
          uVar6 = uVar6 | (ulong)(byte)*puVar3 << 0x38;
        }
      }
      else {
        uVar6 = *puVar3;
        uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
      }
      puVar11 = puVar3;
      if (uVar6 == 0x686169725f6c656e) {
        puVar4 = puVar3 + 1;
        uVar6 = (long)end - (long)puVar4;
        if (uVar6 < 8) {
          uVar10 = 0;
          uVar8 = 0;
          uVar9 = 0;
          uVar7 = 0;
          switch(uVar6) {
          case 7:
          case 6:
          case 5:
          case 4:
            uVar10 = (uint)(char)*(byte *)((long)puVar3 + 0xb);
          case 3:
            uVar8 = uVar10 | (uint)((ulong)((long)(char)*(byte *)((long)puVar3 + 10) << 0x28) >>
                                   0x20);
          case 2:
            uVar9 = uVar8 | (uint)((ulong)((long)(char)*(byte *)((long)puVar3 + 9) << 0x30) >> 0x20)
            ;
          case 1:
            uVar7 = uVar9 | (uint)(((ulong)(byte)*puVar4 << 0x38) >> 0x20);
          }
        }
        else {
          uVar2 = *puVar4;
          uVar7 = (uint)(uVar2 >> 8) & 0xff00 | (uint)(((uVar2 & 0xff00) << 0x28) >> 0x20) |
                  (uint)((uVar2 << 0x38) >> 0x20);
        }
        puVar11 = puVar4;
        if (uVar7 >> 8 != 0x677468) goto LAB_00116f05;
        if (3 < (long)uVar6) {
          bVar1 = *(byte *)((long)puVar3 + 0xb);
          if (ctx->unquoted == 0) {
            if (bVar1 == 0x22) {
              buf_00 = (byte *)((long)puVar3 + 0xc);
              goto LAB_00116e1f;
            }
          }
          else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
            buf_00 = (byte *)((long)puVar3 + 0xb);
            ctx->unquoted = 0;
LAB_00116e1f:
            if ((long)end - (long)buf_00 < 2) {
LAB_00116e3d:
              buf_00 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
            }
            else if ((char)*buf_00 < '!') {
              if ((*buf_00 != 0x20) || ((char)buf_00[1] < '!')) goto LAB_00116e3d;
              buf_00 = buf_00 + 1;
            }
            if ((buf_00 == (byte *)end) || (*buf_00 != 0x3a)) {
              puVar11 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)buf_00,end,4);
            }
            else {
              puVar11 = (ulong *)(buf_00 + 1);
              if ((long)end - (long)puVar11 < 2) {
LAB_00116e8e:
                puVar11 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar11,end);
              }
              else if ((char)(byte)*puVar11 < '!') {
                if (((byte)*puVar11 != 0x20) || ((char)buf_00[2] < '!')) goto LAB_00116e8e;
                puVar11 = (ulong *)(buf_00 + 2);
              }
            }
          }
        }
        if (puVar4 == puVar11) goto LAB_00116f05;
        local_4a = 0;
        local_40 = 0;
        local_44 = 0;
        puVar4 = puVar11;
        if ((puVar11 != (ulong *)end) &&
           (puVar4 = (ulong *)flatcc_json_parser_integer
                                        (ctx,(char *)puVar11,end,&local_44,&local_40),
           puVar4 != puVar11)) {
          if (local_44 == 0) {
            if (local_40 < 0x10000) {
              local_4a = (uint16_t)local_40;
              goto LAB_00116f51;
            }
            err = 7;
          }
          else {
            err = 8;
          }
          puVar4 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar4,end,err);
        }
LAB_00116f51:
        if ((puVar11 == puVar4) &&
           (puVar3 = (ulong *)flatcc_json_parser_symbolic_uint16
                                        (ctx,(char *)puVar4,end,
                                         Fantasy_Rapunzel_parse_json_struct_inline::symbolic_parsers
                                         ,&local_4a), bVar12 = puVar3 == puVar4, puVar4 = puVar3,
           puVar3 == (ulong *)end || bVar12)) {
          bVar12 = false;
        }
        else {
          *local_38 = local_4a;
          bVar12 = true;
          puVar3 = puVar4;
        }
        if (!bVar12) {
          pcVar5 = flatcc_json_parser_set_error(ctx,(char *)puVar3,end,0x23);
          return pcVar5;
        }
      }
      else {
LAB_00116f05:
        puVar3 = (ulong *)flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar11,end);
      }
      puVar3 = (ulong *)flatcc_json_parser_object_end(ctx,(char *)puVar3,end,&local_48);
    } while (local_48 != 0);
  }
  return (char *)puVar3;
}

Assistant:

static const char *Fantasy_Rapunzel_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x686169725f6c656e) { /* descend "hair_len" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if ((w & 0xffffff0000000000) == 0x6774680000000000) { /* "gth" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                if (mark != buf) {
                    uint16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_Fantasy_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 0);
                    buf = flatcc_json_parser_uint16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_uint16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_uint16_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "gth" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "gth" */
        } else { /* descend "hair_len" */
            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
        } /* descend "hair_len" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}